

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O2

FT_Error FT_Load_Glyph(FT_Face face,FT_UInt glyph_index,FT_Int32 load_flags)

{
  FT_Pos *pFVar1;
  FT_Int FVar2;
  FT_GlyphSlot slot;
  undefined8 *puVar3;
  void *pvVar4;
  FT_Memory pFVar5;
  FT_Driver pFVar6;
  FT_Module pFVar7;
  ulong uVar8;
  long lVar9;
  FT_Size pFVar10;
  FT_Face_Internal pFVar11;
  FT_Library library;
  FT_Render_Mode render_mode;
  FT_Error FVar12;
  FT_Render_Mode FVar13;
  FT_Slot_Internal pFVar14;
  char *pcVar15;
  FT_Pos FVar16;
  FT_Long FVar17;
  FT_Renderer_conflict pFVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  FT_Pos FVar22;
  ulong uVar23;
  FT_Glyph_Format format;
  bool bVar24;
  ulong uVar25;
  
  if (face == (FT_Face)0x0) {
    return 0x23;
  }
  if (face->size == (FT_Size)0x0) {
    return 0x23;
  }
  slot = face->glyph;
  if (slot == (FT_GlyphSlot)0x0) {
    return 0x23;
  }
  ft_glyphslot_free_bitmap(slot);
  slot->glyph_index = 0;
  (slot->metrics).width = 0;
  (slot->metrics).height = 0;
  (slot->metrics).horiBearingX = 0;
  (slot->metrics).horiBearingY = 0;
  (slot->metrics).horiAdvance = 0;
  (slot->metrics).vertBearingX = 0;
  (slot->metrics).vertBearingY = 0;
  (slot->metrics).vertAdvance = 0;
  (slot->bitmap).rows = 0;
  (slot->bitmap).width = 0;
  (slot->bitmap).pitch = 0;
  (slot->bitmap).pixel_mode = '\0';
  slot->bitmap_left = 0;
  slot->bitmap_top = 0;
  (slot->outline).n_contours = 0;
  (slot->outline).n_points = 0;
  *(undefined4 *)&(slot->outline).field_0x4 = 0;
  (slot->outline).points = (FT_Vector *)0x0;
  (slot->outline).tags = (char *)0x0;
  slot->num_subglyphs = 0;
  (slot->outline).contours = (short *)0x0;
  (slot->outline).flags = 0;
  *(undefined4 *)&(slot->outline).field_0x24 = 0;
  slot->control_len = 0;
  slot->subglyphs = (FT_SubGlyph)0x0;
  slot->control_data = (void *)0x0;
  if ((slot->face->face_flags & 0x10000) == 0) {
    slot->other = (void *)0x0;
  }
  else {
    pFVar14 = slot->internal;
    uVar19 = pFVar14->flags;
    if ((uVar19 & 2) != 0) {
      puVar3 = (undefined8 *)slot->other;
      pvVar4 = (void *)*puVar3;
      if (pvVar4 != (void *)0x0) {
        pFVar5 = slot->face->memory;
        (*pFVar5->free)(pFVar5,pvVar4);
        pFVar14 = slot->internal;
        uVar19 = pFVar14->flags;
      }
      *puVar3 = 0;
      pFVar14->flags = uVar19 & 0xfffffffd;
    }
  }
  (slot->advance).x = 0;
  (slot->advance).y = 0;
  slot->format = FT_GLYPH_FORMAT_NONE;
  slot->linearHoriAdvance = 0;
  slot->linearVertAdvance = 0;
  slot->lsb_delta = 0;
  slot->rsb_delta = 0;
  pFVar6 = face->driver;
  pFVar7 = ((pFVar6->root).library)->auto_hinter;
  if (((face->size->metrics).x_ppem == 0) || ((face->size->metrics).y_ppem == 0)) {
    load_flags = load_flags | 1;
  }
  uVar19 = load_flags | 0x801;
  if (((uint)load_flags >> 10 & 1) == 0) {
    uVar19 = load_flags;
  }
  uVar20 = uVar19 & 0xfffffff1 | 10;
  if ((uVar19 & 1) == 0) {
    uVar20 = uVar19;
  }
  uVar19 = uVar20 & 0xfffffffb;
  if ((uVar20 >> 0x16 & 1) == 0) {
    uVar19 = uVar20;
  }
  if ((((pFVar7 == (FT_Module)0x0) || ((uVar19 & 0x8002) != 0)) ||
      (uVar20 = (uint)face->face_flags, (uVar20 & 0x2001) != 1)) ||
     (((uVar19 >> 0xb & 1) == 0 &&
      (((face->internal->transform_matrix).yx == 0) == ((face->internal->transform_matrix).xx == 0))
      ))) {
LAB_001d7d14:
    FVar12 = (*pFVar6->clazz->load_glyph)(slot,face->size,glyph_index,uVar19);
    if (FVar12 != 0) {
      return FVar12;
    }
    FVar12 = 0;
    if (slot->format == FT_GLYPH_FORMAT_OUTLINE) {
      FVar12 = FT_Outline_Check(&slot->outline);
      if (FVar12 != 0) {
        return FVar12;
      }
      FVar12 = 0;
      if ((uVar19 & 2) == 0) {
        if ((uVar19 & 0x10) == 0) {
          (slot->metrics).vertBearingX = (slot->metrics).vertBearingX & 0xffffffffffffffc0;
          (slot->metrics).vertBearingY = (slot->metrics).vertBearingY & 0xffffffffffffffc0;
          uVar8 = (slot->metrics).horiBearingX;
          lVar9 = (slot->metrics).horiBearingY;
          uVar21 = uVar8 & 0xffffffffffffffc0;
          (slot->metrics).horiBearingX = uVar21;
          uVar23 = lVar9 + 0x3fU & 0xffffffffffffffc0;
          (slot->metrics).horiBearingY = uVar23;
          (slot->metrics).width =
               ((slot->metrics).width + uVar8 + 0x3f & 0xffffffffffffffc0) - uVar21;
          (slot->metrics).height = uVar23 - (lVar9 - (slot->metrics).height & 0xffffffffffffffc0U);
        }
        else {
          pFVar1 = &(slot->metrics).horiBearingX;
          *(byte *)pFVar1 = (byte)*pFVar1 & 0xc0;
          (slot->metrics).horiBearingY = (slot->metrics).horiBearingY + 0x3fU & 0xffffffffffffffc0;
          uVar8 = (slot->metrics).vertBearingX;
          uVar21 = (slot->metrics).vertBearingY;
          uVar23 = uVar8 & 0xffffffffffffffc0;
          uVar25 = uVar21 & 0xffffffffffffffc0;
          (slot->metrics).vertBearingX = uVar23;
          (slot->metrics).vertBearingY = uVar25;
          (slot->metrics).width =
               ((slot->metrics).width + uVar8 + 0x3f & 0xffffffffffffffc0) - uVar23;
          (slot->metrics).height =
               ((slot->metrics).height + uVar21 + 0x3f & 0xffffffffffffffc0) - uVar25;
        }
        (slot->metrics).horiAdvance = (slot->metrics).horiAdvance + 0x20U & 0xffffffffffffffc0;
        (slot->metrics).vertAdvance = (slot->metrics).vertAdvance + 0x20U & 0xffffffffffffffc0;
      }
    }
  }
  else {
    if (((uVar19 & 0x20) == 0) && ((((pFVar6->root).clazz)->module_flags & 0x400) != 0)) {
      pcVar15 = FT_Get_Font_Format(face);
      pcVar15 = strstr(pcVar15,"Type 1");
      if (pcVar15 == (char *)0x0) {
        bVar24 = false;
      }
      else {
        bVar24 = *(int *)&pFVar6[1].root.clazz == 1;
      }
      if (((uVar19 & 0xf0000) != 0x10000) ||
         ((*(byte *)((long)&((pFVar6->root).clazz)->module_flags + 1) >> 3 & 1) != 0 || bVar24)) {
        uVar20 = (uint)face->face_flags;
        if ((((face->face_flags & 8U) == 0) ||
            (((face[5].style_flags == 0 || (*(short *)((long)&face[1].extensions + 6) != 0)) ||
             (face[4].bbox.xMax != 0)))) ||
           (lVar9._0_2_ = face[4].units_per_EM, lVar9._2_2_ = face[4].ascender,
           lVar9._4_2_ = face[4].descender, lVar9._6_2_ = face[4].height, lVar9 != 0))
        goto LAB_001d7d14;
      }
      else {
        uVar20 = (uint)face->face_flags;
      }
    }
    if (((((uVar20 >> 0x10 & 1) == 0) ||
         (FVar12 = (*pFVar6->clazz->load_glyph)(slot,face->size,glyph_index,uVar19 | 0x800000),
         FVar12 != 0)) || (slot->format != FT_GLYPH_FORMAT_SVG)) &&
       ((((face->face_flags & 2) == 0 || ((uVar19 & 8) != 0)) ||
        ((FVar12 = (*pFVar6->clazz->load_glyph)(slot,face->size,glyph_index,uVar19 | 0x4000),
         FVar12 != 0 || (slot->format != FT_GLYPH_FORMAT_BITMAP)))))) {
      pFVar11 = face->internal;
      FVar2 = pFVar11->transform_flags;
      pFVar11->transform_flags = 0;
      FVar12 = (**(code **)((long)pFVar7->clazz->module_interface + 0x18))
                         (pFVar7,slot,face->size,glyph_index,uVar19);
      pFVar11->transform_flags = FVar2;
    }
    else {
      FVar12 = 0;
    }
  }
  if ((uVar19 & 0x10) == 0) {
    FVar22 = (slot->metrics).horiAdvance;
    FVar16 = 0;
  }
  else {
    FVar16 = (slot->metrics).vertAdvance;
    FVar22 = 0;
  }
  (slot->advance).x = FVar22;
  (slot->advance).y = FVar16;
  if (((uVar19 >> 0xd & 1) == 0) && ((face->face_flags & 1) != 0)) {
    pFVar10 = face->size;
    FVar17 = FT_MulDiv(slot->linearHoriAdvance,(pFVar10->metrics).x_scale,0x40);
    slot->linearHoriAdvance = FVar17;
    FVar17 = FT_MulDiv(slot->linearVertAdvance,(pFVar10->metrics).y_scale,0x40);
    slot->linearVertAdvance = FVar17;
  }
  if ((uVar19 >> 0xb & 1) != 0) goto LAB_001d7ed0;
  pFVar11 = face->internal;
  uVar20 = pFVar11->transform_flags;
  if (uVar20 == 0) goto LAB_001d7ed0;
  library = (slot->face->driver->root).library;
  pFVar18 = library->cur_renderer;
  if (pFVar18 == (FT_Renderer_conflict)0x0) {
    format = slot->format;
LAB_001d7e8d:
    pFVar18 = FT_Lookup_Renderer(library,format,(FT_ListNode *)0x0);
    if (pFVar18 != (FT_Renderer_conflict)0x0) goto LAB_001d7ea6;
    if (format == FT_GLYPH_FORMAT_OUTLINE) {
      if ((uVar20 & 1) != 0) {
        FT_Outline_Transform(&slot->outline,&pFVar11->transform_matrix);
        uVar20 = pFVar11->transform_flags;
      }
      if ((uVar20 & 2) != 0) {
        FT_Outline_Translate
                  (&slot->outline,(pFVar11->transform_delta).x,(pFVar11->transform_delta).y);
      }
    }
  }
  else {
    format = slot->format;
    if (pFVar18->glyph_format != format) goto LAB_001d7e8d;
LAB_001d7ea6:
    FVar12 = (*pFVar18->clazz->transform_glyph)
                       (pFVar18,slot,&pFVar11->transform_matrix,&pFVar11->transform_delta);
  }
  FT_Vector_Transform(&slot->advance,&pFVar11->transform_matrix);
LAB_001d7ed0:
  slot->glyph_index = glyph_index;
  slot->internal->load_flags = uVar19;
  if ((((FVar12 == 0) && (FVar12 = 0, (uVar19 & 1) == 0)) &&
      (slot->format != FT_GLYPH_FORMAT_BITMAP)) && (slot->format != FT_GLYPH_FORMAT_COMPOSITE)) {
    FVar13 = uVar19 >> 0x10 & 0xf;
    render_mode = uVar19 >> 0xb & FT_RENDER_MODE_MONO;
    if (FVar13 != FT_RENDER_MODE_NORMAL) {
      render_mode = FVar13;
    }
    if ((uVar19 & 4) != 0) {
      FVar12 = FT_Render_Glyph(slot,render_mode);
      return FVar12;
    }
    FVar12 = 0;
    ft_glyphslot_preset_bitmap(slot,render_mode,(FT_Vector *)0x0);
  }
  return FVar12;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Load_Glyph( FT_Face   face,
                 FT_UInt   glyph_index,
                 FT_Int32  load_flags )
  {
    FT_Error      error;
    FT_Driver     driver;
    FT_GlyphSlot  slot;
    FT_Library    library;
    FT_Bool       autohint = FALSE;
    FT_Module     hinter;
    TT_Face       ttface = (TT_Face)face;


    if ( !face || !face->size || !face->glyph )
      return FT_THROW( Invalid_Face_Handle );

    /* The validity test for `glyph_index' is performed by the */
    /* font drivers.                                           */

    slot = face->glyph;
    ft_glyphslot_clear( slot );

    driver  = face->driver;
    library = driver->root.library;
    hinter  = library->auto_hinter;

    /* undefined scale means no scale */
    if ( face->size->metrics.x_ppem == 0 ||
         face->size->metrics.y_ppem == 0 )
      load_flags |= FT_LOAD_NO_SCALE;

    /* resolve load flags dependencies */

    if ( load_flags & FT_LOAD_NO_RECURSE )
      load_flags |= FT_LOAD_NO_SCALE         |
                    FT_LOAD_IGNORE_TRANSFORM;

    if ( load_flags & FT_LOAD_NO_SCALE )
    {
      load_flags |= FT_LOAD_NO_HINTING |
                    FT_LOAD_NO_BITMAP;

      load_flags &= ~FT_LOAD_RENDER;
    }

    if ( load_flags & FT_LOAD_BITMAP_METRICS_ONLY )
      load_flags &= ~FT_LOAD_RENDER;

    /*
     * Determine whether we need to auto-hint or not.
     * The general rules are:
     *
     * - Do only auto-hinting if we have
     *
     *   - a hinter module,
     *   - a scalable font,
     *   - not a tricky font, and
     *   - no transforms except simple slants and/or rotations by
     *     integer multiples of 90 degrees.
     *
     * - Then, auto-hint if FT_LOAD_FORCE_AUTOHINT is set or if we don't
     *   have a native font hinter.
     *
     * - Otherwise, auto-hint for LIGHT hinting mode or if there isn't
     *   any hinting bytecode in the TrueType/OpenType font.
     *
     * - Exception: The font is `tricky' and requires the native hinter to
     *   load properly.
     */

    if ( hinter                                           &&
         !( load_flags & FT_LOAD_NO_HINTING )             &&
         !( load_flags & FT_LOAD_NO_AUTOHINT )            &&
         FT_IS_SCALABLE( face )                           &&
         !FT_IS_TRICKY( face )                            &&
         ( ( load_flags & FT_LOAD_IGNORE_TRANSFORM )    ||
           ( face->internal->transform_matrix.yx == 0 &&
             face->internal->transform_matrix.xx != 0 ) ||
           ( face->internal->transform_matrix.xx == 0 &&
             face->internal->transform_matrix.yx != 0 ) ) )
    {
      if ( ( load_flags & FT_LOAD_FORCE_AUTOHINT ) ||
           !FT_DRIVER_HAS_HINTER( driver )         )
        autohint = TRUE;
      else
      {
        FT_Render_Mode  mode = FT_LOAD_TARGET_MODE( load_flags );
        FT_Bool         is_light_type1;


        /* only the new Adobe engine (for both CFF and Type 1) is `light'; */
        /* we use `strstr' to catch both `Type 1' and `CID Type 1'         */
        is_light_type1 =
          ft_strstr( FT_Get_Font_Format( face ), "Type 1" ) != NULL &&
          ((PS_Driver)driver)->hinting_engine == FT_HINTING_ADOBE;

        /* the check for `num_locations' assures that we actually    */
        /* test for instructions in a TTF and not in a CFF-based OTF */
        /*                                                           */
        /* since `maxSizeOfInstructions' might be unreliable, we     */
        /* check the size of the `fpgm' and `prep' tables, too --    */
        /* the assumption is that there don't exist real TTFs where  */
        /* both `fpgm' and `prep' tables are missing                 */
        if ( ( mode == FT_RENDER_MODE_LIGHT           &&
               ( !FT_DRIVER_HINTS_LIGHTLY( driver ) &&
                 !is_light_type1                    ) )         ||
             ( FT_IS_SFNT( face )                             &&
               ttface->num_locations                          &&
               ttface->max_profile.maxSizeOfInstructions == 0 &&
               ttface->font_program_size == 0                 &&
               ttface->cvt_program_size == 0                  ) )
          autohint = TRUE;
      }
    }

    if ( autohint )
    {
      FT_AutoHinter_Interface  hinting;


      /* XXX: The use of the `FT_LOAD_XXX_ONLY` flags is not very */
      /*      elegant.                                            */

      /* try to load SVG documents if available */
      if ( FT_HAS_SVG( face ) )
      {
        error = driver->clazz->load_glyph( slot, face->size,
                                           glyph_index,
                                           load_flags | FT_LOAD_SVG_ONLY );

        if ( !error && slot->format == FT_GLYPH_FORMAT_SVG )
          goto Load_Ok;
      }

      /* try to load embedded bitmaps if available */
      if ( FT_HAS_FIXED_SIZES( face )              &&
           ( load_flags & FT_LOAD_NO_BITMAP ) == 0 )
      {
        error = driver->clazz->load_glyph( slot, face->size,
                                           glyph_index,
                                           load_flags | FT_LOAD_SBITS_ONLY );

        if ( !error && slot->format == FT_GLYPH_FORMAT_BITMAP )
          goto Load_Ok;
      }

      {
        FT_Face_Internal  internal        = face->internal;
        FT_Int            transform_flags = internal->transform_flags;


        /* since the auto-hinter calls FT_Load_Glyph by itself, */
        /* make sure that glyphs aren't transformed             */
        internal->transform_flags = 0;

        /* load auto-hinted outline */
        hinting = (FT_AutoHinter_Interface)hinter->clazz->module_interface;

        error   = hinting->load_glyph( (FT_AutoHinter)hinter,
                                       slot, face->size,
                                       glyph_index, load_flags );

        internal->transform_flags = transform_flags;
      }
    }
    else
    {
      error = driver->clazz->load_glyph( slot,
                                         face->size,
                                         glyph_index,
                                         load_flags );
      if ( error )
        goto Exit;

      if ( slot->format == FT_GLYPH_FORMAT_OUTLINE )
      {
        /* check that the loaded outline is correct */
        error = FT_Outline_Check( &slot->outline );
        if ( error )
          goto Exit;

#ifdef GRID_FIT_METRICS
        if ( !( load_flags & FT_LOAD_NO_HINTING ) )
          ft_glyphslot_grid_fit_metrics(
            slot,
            FT_BOOL( load_flags & FT_LOAD_VERTICAL_LAYOUT ) );
#endif
      }
    }

  Load_Ok:
    /* compute the advance */
    if ( load_flags & FT_LOAD_VERTICAL_LAYOUT )
    {
      slot->advance.x = 0;
      slot->advance.y = slot->metrics.vertAdvance;
    }
    else
    {
      slot->advance.x = slot->metrics.horiAdvance;
      slot->advance.y = 0;
    }

    /* compute the linear advance in 16.16 pixels */
    if ( ( load_flags & FT_LOAD_LINEAR_DESIGN ) == 0 &&
         FT_IS_SCALABLE( face )                      )
    {
      FT_Size_Metrics*  metrics = &face->size->metrics;


      /* it's tricky! */
      slot->linearHoriAdvance = FT_MulDiv( slot->linearHoriAdvance,
                                           metrics->x_scale, 64 );

      slot->linearVertAdvance = FT_MulDiv( slot->linearVertAdvance,
                                           metrics->y_scale, 64 );
    }

    if ( ( load_flags & FT_LOAD_IGNORE_TRANSFORM ) == 0 )
    {
      FT_Face_Internal  internal = face->internal;


      /* now, transform the glyph image if needed */
      if ( internal->transform_flags )
      {
        /* get renderer */
        FT_Renderer  renderer = ft_lookup_glyph_renderer( slot );


        if ( renderer )
          error = renderer->clazz->transform_glyph(
                                     renderer, slot,
                                     &internal->transform_matrix,
                                     &internal->transform_delta );
        else if ( slot->format == FT_GLYPH_FORMAT_OUTLINE )
        {
          /* apply `standard' transformation if no renderer is available */
          if ( internal->transform_flags & 1 )
            FT_Outline_Transform( &slot->outline,
                                  &internal->transform_matrix );

          if ( internal->transform_flags & 2 )
            FT_Outline_Translate( &slot->outline,
                                  internal->transform_delta.x,
                                  internal->transform_delta.y );
        }

        /* transform advance */
        FT_Vector_Transform( &slot->advance, &internal->transform_matrix );
      }
    }

    slot->glyph_index          = glyph_index;
    slot->internal->load_flags = load_flags;

    /* do we need to render the image or preset the bitmap now? */
    if ( !error                                    &&
         ( load_flags & FT_LOAD_NO_SCALE ) == 0    &&
         slot->format != FT_GLYPH_FORMAT_BITMAP    &&
         slot->format != FT_GLYPH_FORMAT_COMPOSITE )
    {
      FT_Render_Mode  mode = FT_LOAD_TARGET_MODE( load_flags );


      if ( mode == FT_RENDER_MODE_NORMAL   &&
           load_flags & FT_LOAD_MONOCHROME )
        mode = FT_RENDER_MODE_MONO;

      if ( load_flags & FT_LOAD_RENDER )
        error = FT_Render_Glyph( slot, mode );
      else
        ft_glyphslot_preset_bitmap( slot, mode, NULL );
    }

#ifdef FT_DEBUG_LEVEL_TRACE
    FT_TRACE5(( "FT_Load_Glyph: index %d, flags 0x%x\n",
                glyph_index, load_flags ));
    FT_TRACE5(( "  bitmap %dx%d %s, %s (mode %d)\n",
                slot->bitmap.width,
                slot->bitmap.rows,
                slot->outline.points ?
                  slot->bitmap.buffer ? "rendered"
                                      : "preset"
                                     :
                  slot->internal->flags & FT_GLYPH_OWN_BITMAP ? "owned"
                                                              : "unowned",
                pixel_modes[slot->bitmap.pixel_mode],
                slot->bitmap.pixel_mode ));
    FT_TRACE5(( "\n" ));
    FT_TRACE5(( "  x advance: %f\n", (double)slot->advance.x / 64 ));
    FT_TRACE5(( "  y advance: %f\n", (double)slot->advance.y / 64 ));
    FT_TRACE5(( "  linear x advance: %f\n",
                (double)slot->linearHoriAdvance / 65536 ));
    FT_TRACE5(( "  linear y advance: %f\n",
                (double)slot->linearVertAdvance / 65536 ));

    {
      FT_Glyph_Metrics*  metrics = &slot->metrics;


      FT_TRACE5(( "  metrics:\n" ));
      FT_TRACE5(( "    width:  %f\n", (double)metrics->width / 64 ));
      FT_TRACE5(( "    height: %f\n", (double)metrics->height / 64 ));
      FT_TRACE5(( "\n" ));
      FT_TRACE5(( "    horiBearingX: %f\n",
                  (double)metrics->horiBearingX / 64 ));
      FT_TRACE5(( "    horiBearingY: %f\n",
                  (double)metrics->horiBearingY / 64 ));
      FT_TRACE5(( "    horiAdvance:  %f\n",
                  (double)metrics->horiAdvance / 64 ));
      FT_TRACE5(( "\n" ));
      FT_TRACE5(( "    vertBearingX: %f\n",
                  (double)metrics->vertBearingX / 64 ));
      FT_TRACE5(( "    vertBearingY: %f\n",
                  (double)metrics->vertBearingY / 64 ));
      FT_TRACE5(( "    vertAdvance:  %f\n",
                  (double)metrics->vertAdvance / 64 ));
    }
#endif

  Exit:
    return error;
  }